

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

QVariant * __thiscall QTextEditControl::loadResource(QTextEditControl *this,int type,QUrl *name)

{
  QTextEdit *pQVar1;
  QTextEditPrivate *pQVar2;
  undefined8 in_RCX;
  undefined4 in_EDX;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QTextEdit *ed;
  QUrl resolvedName;
  QUrl *in_stack_ffffffffffffffa8;
  QVariant *this_00;
  QUrl local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QObject::parent((QObject *)0x6d93d5);
  pQVar1 = qobject_cast<QTextEdit*>((QObject *)0x6d93dd);
  if (pQVar1 == (QTextEdit *)0x0) {
    QWidgetTextControl::loadResource
              ((QWidgetTextControl *)this_00,(int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffa8)
    ;
  }
  else {
    local_10.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = QTextEdit::d_func((QTextEdit *)0x6d941a);
    (**(code **)(*(long *)&(pQVar2->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                           super_QWidgetPrivate + 0xc0))(&local_10,pQVar2,in_RCX);
    (**(code **)(*(long *)&(pQVar1->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x1c8))
              (in_RDI,pQVar1,in_EDX,&local_10);
    QUrl::~QUrl(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QVariant loadResource(int type, const QUrl &name) override {
        auto *ed = qobject_cast<QTextEdit *>(parent());
        if (!ed)
            return QWidgetTextControl::loadResource(type, name);

        QUrl resolvedName = ed->d_func()->resolveUrl(name);
        return ed->loadResource(type, resolvedName);
    }